

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O2

Matrix<float,_4,_4> *
deqp::gles3::Functional::MatrixCaseUtils::inverse<4>
          (Matrix<float,_4,_4> *__return_storage_ptr__,Matrix<float,_4,_4> *mat)

{
  Matrix<float,_2,_2> blockD;
  Matrix<float,_2,_2> blockC;
  Matrix<float,_2,_2> invA;
  Matrix<float,_2,_2> zeroMat;
  Matrix<float,_2,_2> schurComplement;
  Matrix<float,_2,_2> blockB;
  Matrix<float,_2,_2> blockA;
  Matrix<float,_2,_2> matB;
  Matrix<float,_2,_2> matC;
  float nullField [4];
  Matrix<float,_2,_2> matD;
  float areaD [4];
  float areaC [4];
  float areaB [4];
  float areaA [4];
  Matrix<float,_2,_2> local_168;
  Matrix<float,_2,_2> local_158;
  Matrix<float,_2,_2> local_148;
  Matrix<float,_2,_2> local_138;
  Matrix<float,_2,_2> local_128;
  Matrix<float,_2,_2> local_118;
  Matrix<float,_2,_2> local_108;
  Matrix<float,_2,_2> local_f8;
  Matrix<float,_2,_2> local_e8;
  Matrix<float,_2,_2> local_d8;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_98 [4];
  Matrix<float,_2,_2> local_88;
  float local_78;
  float local_74;
  float local_70;
  float local_6c;
  float local_68;
  float local_64;
  float local_60;
  float local_5c;
  float local_58;
  float local_54;
  float local_50;
  float local_4c;
  float local_48;
  float local_44;
  float local_40;
  float local_3c;
  
  local_48 = (mat->m_data).m_data[0].m_data[0];
  local_44 = (mat->m_data).m_data[1].m_data[0];
  local_40 = (mat->m_data).m_data[0].m_data[1];
  local_3c = (mat->m_data).m_data[1].m_data[1];
  local_58 = (mat->m_data).m_data[2].m_data[0];
  local_54 = (mat->m_data).m_data[3].m_data[0];
  local_50 = (mat->m_data).m_data[2].m_data[1];
  local_4c = (mat->m_data).m_data[3].m_data[1];
  local_68 = (mat->m_data).m_data[0].m_data[2];
  local_64 = (mat->m_data).m_data[1].m_data[2];
  local_60 = (mat->m_data).m_data[0].m_data[3];
  local_5c = (mat->m_data).m_data[1].m_data[3];
  local_78 = (mat->m_data).m_data[2].m_data[2];
  local_74 = (mat->m_data).m_data[3].m_data[2];
  local_70 = (mat->m_data).m_data[2].m_data[3];
  local_6c = (mat->m_data).m_data[3].m_data[3];
  local_98[0] = 0.0;
  local_98[1] = 0.0;
  local_98[2] = 0.0;
  local_98[3] = 0.0;
  tcu::Matrix<float,_2,_2>::Matrix(&local_d8,&local_48);
  inverse<2>((MatrixCaseUtils *)&local_148,&local_d8);
  tcu::Matrix<float,_2,_2>::Matrix(&local_f8,&local_58);
  tcu::Matrix<float,_2,_2>::Matrix(&local_e8,&local_68);
  tcu::Matrix<float,_2,_2>::Matrix(&local_88,&local_78);
  tcu::operator*((tcu *)&local_108,&local_e8,&local_148);
  tcu::operator*((tcu *)&local_138,&local_108,&local_f8);
  tcu::operator-((tcu *)&local_d8,&local_88,&local_138);
  inverse<2>((MatrixCaseUtils *)&local_128,&local_d8);
  tcu::Matrix<float,_2,_2>::Matrix(&local_138,local_98);
  tcu::operator*((tcu *)&local_168,&local_148,&local_f8);
  tcu::operator*((tcu *)&local_158,&local_168,&local_128);
  tcu::operator*((tcu *)&local_118,&local_158,&local_e8);
  tcu::operator*((tcu *)&local_d8,&local_118,&local_148);
  tcu::operator+((tcu *)&local_108,&local_148,&local_d8);
  tcu::operator-((tcu *)&local_158,&local_138,&local_148);
  tcu::operator*((tcu *)&local_d8,&local_158,&local_f8);
  tcu::operator*((tcu *)&local_118,&local_d8,&local_128);
  tcu::operator-((tcu *)&local_168,&local_138,&local_128);
  tcu::operator*((tcu *)&local_d8,&local_168,&local_e8);
  tcu::operator*((tcu *)&local_158,&local_d8,&local_148);
  tcu::Matrix<float,_2,_2>::Matrix(&local_168,&local_128);
  local_c8 = local_108.m_data.m_data[0].m_data[1];
  fStack_c4 = local_108.m_data.m_data[1].m_data[1];
  fStack_c0 = local_118.m_data.m_data[0].m_data[1];
  fStack_bc = local_118.m_data.m_data[1].m_data[1];
  local_d8.m_data.m_data[0].m_data[0] = local_108.m_data.m_data[0].m_data[0];
  local_d8.m_data.m_data[0].m_data[1] = local_108.m_data.m_data[1].m_data[0];
  local_d8.m_data.m_data[1].m_data[0] = local_118.m_data.m_data[0].m_data[0];
  local_d8.m_data.m_data[1].m_data[1] = local_118.m_data.m_data[1].m_data[0];
  local_a8 = local_158.m_data.m_data[0].m_data[1];
  fStack_a4 = local_158.m_data.m_data[1].m_data[1];
  fStack_a0 = local_168.m_data.m_data[0].m_data[1];
  fStack_9c = local_168.m_data.m_data[1].m_data[1];
  local_b8 = local_158.m_data.m_data[0].m_data[0];
  fStack_b4 = local_158.m_data.m_data[1].m_data[0];
  fStack_b0 = local_168.m_data.m_data[0].m_data[0];
  fStack_ac = local_168.m_data.m_data[1].m_data[0];
  tcu::Matrix<float,_4,_4>::Matrix(__return_storage_ptr__,(float *)&local_d8);
  return __return_storage_ptr__;
}

Assistant:

tcu::Matrix<float, 4, 4> inverse<4> (const tcu::Matrix<float, 4, 4>& mat)
{
	// Blockwise inversion

	DE_ASSERT(determinant(mat) != 0.0f);

	const float areaA[2*2] =
	{
		mat(0,0),	mat(0,1),
		mat(1,0),	mat(1,1)
	};
	const float areaB[2*2] =
	{
		mat(0,2),	mat(0,3),
		mat(1,2),	mat(1,3)
	};
	const float areaC[2*2] =
	{
		mat(2,0),	mat(2,1),
		mat(3,0),	mat(3,1)
	};
	const float areaD[2*2] =
	{
		mat(2,2),	mat(2,3),
		mat(3,2),	mat(3,3)
	};
	const float nullField[4] = { 0.0f };

	const tcu::Matrix<float, 2, 2> invA = inverse(Mat2(areaA));
	const tcu::Matrix<float, 2, 2> matB =         Mat2(areaB);
	const tcu::Matrix<float, 2, 2> matC =         Mat2(areaC);
	const tcu::Matrix<float, 2, 2> matD =         Mat2(areaD);

	const tcu::Matrix<float, 2, 2> schurComplement = inverse(matD - matC*invA*matB);
	const tcu::Matrix<float, 2, 2> zeroMat         = Mat2(nullField);

	const tcu::Matrix<float, 2, 2> blockA = invA + invA*matB*schurComplement*matC*invA;
	const tcu::Matrix<float, 2, 2> blockB = (zeroMat-invA)*matB*schurComplement;
	const tcu::Matrix<float, 2, 2> blockC = (zeroMat-schurComplement)*matC*invA;
	const tcu::Matrix<float, 2, 2> blockD = schurComplement;

	const float result[4*4] =
	{
		blockA(0,0),	blockA(0,1),	blockB(0,0),	blockB(0,1),
		blockA(1,0),	blockA(1,1),	blockB(1,0),	blockB(1,1),
		blockC(0,0),	blockC(0,1),	blockD(0,0),	blockD(0,1),
		blockC(1,0),	blockC(1,1),	blockD(1,0),	blockD(1,1),
	};

	return Mat4(result);
}